

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O2

void __thiscall
cnn::KMaxPooling::forward_impl
          (KMaxPooling *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  float fVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  Scalar *pSVar4;
  uint uVar5;
  ulong uVar6;
  ulong row;
  uint j;
  ulong uVar7;
  ulong col;
  ulong uVar8;
  undefined1 auVar9 [16];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> y;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  float tmp [1024];
  float local_1088;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1078;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1058;
  float local_1038 [1026];
  
  Tensor::operator*(&local_1058,
                    *(xs->
                     super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                     _M_impl.super__Vector_impl_data._M_start);
  Tensor::operator*(&local_1078,fx);
  if (0x3ff < local_1058.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value) {
    __assert_fail("x.cols() < 1024",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/conv.cc"
                  ,0x122,
                  "virtual void cnn::KMaxPooling::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  uVar8 = local_1058.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value & 0xffffffff;
  row = 0;
  uVar6 = 0;
  pvVar2 = (this->super_Node).aux_mem;
  do {
    if (row == (uint)local_1058.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_rows.m_value) {
      uVar5 = Dim::size(&(this->super_Node).dim);
      if ((uint)uVar6 == uVar5) {
        return;
      }
      __assert_fail("mi == dim.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/conv.cc"
                    ,0x13b,
                    "virtual void cnn::KMaxPooling::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      pSVar4 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             *)&local_1058,row,uVar7);
      auVar3._8_4_ = 0x80000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._12_4_ = 0x80000000;
      auVar9 = vxorps_avx512vl(ZEXT416((uint)*pSVar4),auVar3);
      local_1038[uVar7] = auVar9._0_4_;
    }
    std::nth_element<float*>(local_1038,local_1038 + (this->k - 1),local_1038 + uVar8);
    col = 0;
    uVar7 = 0;
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar9 = vxorps_avx512vl(ZEXT416((uint)local_1038[this->k - 1]),auVar9);
    for (; uVar8 != col; col = col + 1) {
      pSVar4 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             *)&local_1058,row,col);
      fVar1 = *pSVar4;
      local_1088 = auVar9._0_4_;
      if (local_1088 <= fVar1) {
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                               *)&local_1078,row,uVar7);
        uVar5 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar5;
        *pSVar4 = fVar1;
        *(int *)((long)pvVar2 + uVar6 * 4) = (int)col;
        uVar6 = (ulong)((int)uVar6 + 1);
        if (uVar5 == this->k) break;
      }
    }
    row = row + 1;
  } while( true );
}

Assistant:

void KMaxPooling::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("KMaxPooling::forward not implemented for CUDA");
#else
  auto x=**xs[0];
  auto y=*fx;
  float tmp[1024];
  assert(x.cols() < 1024);
  unsigned mi = 0;
  const unsigned rows = x.rows();
  const unsigned xcols = x.cols();
  int* maxmap = static_cast<int*>(aux_mem);
  for (unsigned i=0; i < rows; ++i) {
    //cerr << "row(" << i << ")=" << x.row(i) << endl;
    for (unsigned j=0; j < xcols; ++j)
      tmp[j] = -x(i,j);
    nth_element(tmp, tmp + (k-1), tmp + xcols);
    const float c = -tmp[k-1];  // kth largest element in row i
    unsigned tt = 0;
    for (unsigned j = 0; j < xcols; ++j) {
      const float xij = x(i,j);
      if (xij >= c) {
        //cerr << xij << ' ';
        y(i,tt) = xij;
        //assert(mi < dim.size());
        maxmap[mi++] = j;
        ++tt;
        if (tt == k) break;  // could happen in case of ties
      }
    }
    //cerr << endl; abort();
  }
  assert(mi == dim.size());
#endif
}